

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void fmt::v5::internal::sprintf_format<double>(double value,buffer *buf,core_format_specs spec)

{
  int value_00;
  type tVar1;
  assertion_failure *this;
  char *pcVar2;
  ulong uVar3;
  char format [10];
  
  if (buf->capacity_ == 0) {
    this = (assertion_failure *)__cxa_allocate_exception(0x10);
    assertion_failure::assertion_failure(this,"empty buffer");
    __cxa_throw(this,&assertion_failure::typeinfo,std::logic_error::~logic_error);
  }
  format[0] = '%';
  if (((ulong)spec >> 0x23 & 1) == 0) {
    pcVar2 = format + 1;
  }
  else {
    pcVar2 = format + 2;
    format[1] = '#';
  }
  if (-1 < spec.precision) {
    pcVar2[0] = '.';
    pcVar2[1] = '*';
    pcVar2 = pcVar2 + 2;
  }
  *pcVar2 = spec.type;
  pcVar2[1] = '\0';
LAB_0010f07c:
  do {
    value_00 = char_traits<char>::format_float<double>
                         (buf->ptr_,buf->capacity_,format,spec.precision,value);
    if (value_00 < 0) goto LAB_0010f0b4;
    tVar1 = to_unsigned<int>(value_00);
    if ((ulong)tVar1 < buf->capacity_) {
      basic_buffer<char>::resize(buf,(ulong)tVar1);
      return;
    }
    uVar3 = (ulong)(tVar1 + 1);
  } while (uVar3 <= buf->capacity_);
  goto LAB_0010f0c1;
LAB_0010f0b4:
  if (buf->capacity_ != 0xffffffffffffffff) {
    uVar3 = buf->capacity_ + 1;
LAB_0010f0c1:
    (**buf->_vptr_basic_buffer)(buf,uVar3);
  }
  goto LAB_0010f07c;
}

Assistant:

void sprintf_format(Double value, internal::buffer &buf,
                    core_format_specs spec) {
  // Buffer capacity must be non-zero, otherwise MSVC's vsnprintf_s will fail.
  FMT_ASSERT(buf.capacity() != 0, "empty buffer");

  // Build format string.
  enum { MAX_FORMAT_SIZE = 10}; // longest format: %#-*.*Lg
  char format[MAX_FORMAT_SIZE];
  char *format_ptr = format;
  *format_ptr++ = '%';
  if (spec.has(HASH_FLAG))
    *format_ptr++ = '#';
  if (spec.precision >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }
  if (std::is_same<Double, long double>::value)
    *format_ptr++ = 'L';
  *format_ptr++ = spec.type;
  *format_ptr = '\0';

  // Format using snprintf.
  char *start = FMT_NULL;
  for (;;) {
    std::size_t buffer_size = buf.capacity();
    start = &buf[0];
    int result = internal::char_traits<char>::format_float(
        start, buffer_size, format, spec.precision, value);
    if (result >= 0) {
      unsigned n = internal::to_unsigned(result);
      if (n < buf.capacity()) {
        buf.resize(n);
        break;  // The buffer is large enough - continue with formatting.
      }
      buf.reserve(n + 1);
    } else {
      // If result is negative we ask to increase the capacity by at least 1,
      // but as std::vector, the buffer grows exponentially.
      buf.reserve(buf.capacity() + 1);
    }
  }
}